

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O1

uint32 rw::d3d9::getDeclaration(void *declaration,VertexElement *elements)

{
  short *psVar1;
  ulong uVar2;
  uint32 uVar3;
  
  uVar3 = 0;
  uVar2 = 0;
  do {
    uVar3 = uVar3 + 1;
    psVar1 = (short *)((long)declaration + uVar2);
    uVar2 = uVar2 + 8;
  } while (*psVar1 != 0xff);
  if (elements != (VertexElement *)0x0) {
    memcpy(elements,declaration,uVar2 & 0x7fffffff8);
  }
  return uVar3;
}

Assistant:

uint32
getDeclaration(void *declaration, VertexElement *elements)
{
#ifdef RW_D3D9
	IDirect3DVertexDeclaration9 *decl = (IDirect3DVertexDeclaration9*)declaration;
	UINT numElt;
	decl->GetDeclaration((D3DVERTEXELEMENT9*)elements, &numElt);
	return numElt;
#else
	int n = 0;
	VertexElement *e = (VertexElement*)declaration;
	while(e[n++].stream != 0xFF)
		;
	if(elements)
		memcpy(elements, declaration, n*sizeof(VertexElement));
	return n;
#endif
}